

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder.cpp
# Opt level: O3

disp_binder_unique_ptr_t so_5::create_default_disp_binder(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true> in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[2] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  *puVar1 = &PTR__pre5_5_19_default_disp_binder_t_00285b60;
  *(undefined1 *)(puVar1 + 1) = 0;
  puVar1[2] = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t
   .super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
   super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
         )(tuple<so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>)
          in_RDI.
          super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t
          .super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
          super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
}

Assistant:

SO_5_FUNC disp_binder_unique_ptr_t
create_default_disp_binder()
	{
		return stdcpp::make_unique< impl::pre5_5_19_default_disp_binder_t >();
	}